

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

void prepvarinfo(rnndb *db,char *what,rnnvarinfo *vi,rnnvarinfo *parent)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  rnnenum *prVar5;
  rnnvarset **pprVar6;
  rnnvarset *prVar7;
  char *pcVar8;
  int *piVar9;
  char *name;
  rnnvalue **pprVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  byte *pbVar14;
  byte *__string;
  byte *pbVar15;
  bool bVar16;
  
  if (parent != (rnnvarinfo *)0x0) {
    vi->prefenum = parent->prefenum;
  }
  pcVar8 = vi->prefixstr;
  if (pcVar8 != (char *)0x0) {
    iVar3 = strcmp(pcVar8,"none");
    if (iVar3 == 0) {
      prVar5 = (rnnenum *)0x0;
    }
    else {
      prVar5 = rnn_findenum(db,pcVar8);
    }
    vi->prefenum = prVar5;
  }
  if ((parent != (rnnvarinfo *)0x0) && (0 < parent->varsetsnum)) {
    lVar13 = 0;
    do {
      iVar3 = vi->varsetsmax;
      if (iVar3 <= vi->varsetsnum) {
        iVar4 = iVar3 * 2;
        if (iVar3 == 0) {
          iVar4 = 0x10;
        }
        vi->varsetsmax = iVar4;
        pprVar6 = (rnnvarset **)realloc(vi->varsets,(long)iVar4 << 3);
        vi->varsets = pprVar6;
      }
      prVar7 = copyvarset(parent->varsets[lVar13]);
      iVar3 = vi->varsetsnum;
      vi->varsetsnum = iVar3 + 1;
      vi->varsets[iVar3] = prVar7;
      lVar13 = lVar13 + 1;
    } while (lVar13 < parent->varsetsnum);
  }
  prVar5 = vi->prefenum;
  if (((prVar5 == (rnnenum *)0x0) && (parent != (rnnvarinfo *)0x0)) &&
     (vi->varsetstr == (char *)0x0)) {
    if (parent->varsetstr == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = strdup(parent->varsetstr);
    }
    vi->varsetstr = pcVar8;
  }
  if (vi->varsetstr != (char *)0x0) {
    prVar5 = rnn_findenum(db,vi->varsetstr);
  }
  __string = (byte *)vi->variantsstr;
  if (__string != (byte *)0x0) {
    if (prVar5 == (rnnenum *)0x0) {
      fprintf(_stderr,"%s: tried to use variants without active varset!\n",what);
      db->estatus = 1;
    }
    else {
      uVar2 = prVar5->valsnum;
      iVar3 = vi->varsetsnum;
      if (0 < (long)iVar3) {
        lVar13 = 0;
        do {
          prVar7 = vi->varsets[lVar13];
          if (prVar7->venum == prVar5) goto LAB_00105e0d;
          lVar13 = lVar13 + 1;
        } while (iVar3 != lVar13);
      }
      prVar7 = (rnnvarset *)0x0;
LAB_00105e0d:
      if (prVar7 == (rnnvarset *)0x0) {
        prVar7 = (rnnvarset *)calloc(0x10,1);
        prVar7->venum = prVar5;
        piVar9 = (int *)calloc(4,(long)(int)uVar2);
        prVar7->variants = piVar9;
        if (0 < (int)uVar2) {
          uVar12 = 0;
          do {
            piVar9[uVar12] = 1;
            uVar12 = uVar12 + 1;
          } while (uVar2 != uVar12);
        }
        iVar4 = vi->varsetsmax;
        if (iVar4 <= iVar3) {
          iVar3 = 0x10;
          if (iVar4 != 0) {
            iVar3 = iVar4 * 2;
          }
          vi->varsetsmax = iVar3;
          pprVar6 = (rnnvarset **)realloc(vi->varsets,(long)iVar3 << 3);
          vi->varsets = pprVar6;
        }
        iVar3 = vi->varsetsnum;
        vi->varsetsnum = iVar3 + 1;
        vi->varsets[iVar3] = prVar7;
      }
      while( true ) {
        for (; *__string == 0x20; __string = __string + 1) {
        }
        pbVar14 = __string;
        pbVar15 = __string;
        if (*__string == 0) break;
        while( true ) {
          pbVar15 = pbVar15 + 1;
          bVar1 = *pbVar14;
          if (((ulong)bVar1 < 0x3b) && ((0x400200100000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
          break;
          pbVar14 = pbVar14 + 1;
        }
        if ((long)pbVar14 - (long)__string == 0) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8 = strndup((char *)__string,(long)pbVar14 - (long)__string);
        }
        if ((bVar1 & 0xdf) == 0) {
          iVar3 = findvidx(db,prVar5,pcVar8);
          __string = pbVar14;
          if (iVar3 != -1) {
            prVar7->variants[iVar3] = prVar7->variants[iVar3] | 2;
          }
        }
        else {
          lVar13 = 0;
          for (; (*pbVar15 & 0xdf) != 0; pbVar15 = pbVar15 + 1) {
            lVar13 = lVar13 + -1;
          }
          if (lVar13 == 0) {
            name = (char *)0x0;
          }
          else {
            name = strndup((char *)(pbVar14 + 1),-lVar13);
          }
          if (pcVar8 == (char *)0x0) {
            iVar3 = 0;
          }
          else {
            iVar3 = findvidx(db,prVar5,pcVar8);
          }
          uVar11 = uVar2;
          if (name != (char *)0x0) {
            iVar4 = findvidx(db,prVar5,name);
            uVar11 = (uint)(*pbVar14 == 0x2d) + iVar4;
          }
          if (((iVar3 != -1) && (uVar11 != 0xffffffff)) && (iVar3 < (int)uVar11)) {
            piVar9 = prVar7->variants;
            lVar13 = (long)iVar3;
            do {
              *(byte *)(piVar9 + lVar13) = *(byte *)(piVar9 + lVar13) | 2;
              lVar13 = lVar13 + 1;
            } while ((int)uVar11 != lVar13);
          }
          free(name);
          __string = pbVar15;
        }
        free(pcVar8);
      }
      vi->dead = 1;
      if (0 < (int)uVar2) {
        piVar9 = prVar7->variants;
        uVar12 = 0;
        do {
          bVar16 = piVar9[uVar12] == 3;
          piVar9[uVar12] = (uint)bVar16;
          if (bVar16) {
            vi->dead = 0;
          }
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
    }
    if (prVar5 == (rnnenum *)0x0) {
      return;
    }
  }
  if ((vi->dead == 0) && (prVar5 = vi->prefenum, prVar5 != (rnnenum *)0x0)) {
    if (0 < (long)vi->varsetsnum) {
      lVar13 = 0;
      do {
        prVar7 = vi->varsets[lVar13];
        if (prVar7->venum == prVar5) goto LAB_0010608b;
        lVar13 = lVar13 + 1;
      } while (vi->varsetsnum != lVar13);
    }
    prVar7 = (rnnvarset *)0x0;
LAB_0010608b:
    if (prVar7 == (rnnvarset *)0x0) {
      pprVar10 = prVar5->vals;
LAB_001060fa:
      pcVar8 = strdup((*pprVar10)->name);
      vi->prefix = pcVar8;
    }
    else if (0 < (long)prVar5->valsnum) {
      piVar9 = prVar7->variants;
      lVar13 = 0;
      do {
        if (*piVar9 != 0) {
          pprVar10 = (rnnvalue **)((long)prVar5->vals - lVar13);
          goto LAB_001060fa;
        }
        lVar13 = lVar13 + -8;
        piVar9 = piVar9 + 1;
      } while ((long)prVar5->valsnum * 8 + lVar13 != 0);
    }
  }
  return;
}

Assistant:

static void prepvarinfo (struct rnndb *db, char *what, struct rnnvarinfo *vi, struct rnnvarinfo *parent) {
	if (parent)
		vi->prefenum = parent->prefenum;
	if (vi->prefixstr) {
		if (!strcmp(vi->prefixstr, "none"))
			vi->prefenum = 0;
		else
			vi->prefenum = rnn_findenum(db, vi->prefixstr); // XXX
	}
	int i;
	if (parent)
		for (i = 0; i < parent->varsetsnum; i++)
			ADDARRAY(vi->varsets, copyvarset(parent->varsets[i]));
	struct rnnenum *varset = vi->prefenum;
	if (!varset && !vi->varsetstr && parent)
		vi->varsetstr = parent->varsetstr ? strdup(parent->varsetstr) : NULL;
	if (vi->varsetstr)
		varset = rnn_findenum(db, vi->varsetstr);
	if (vi->variantsstr) {
		char *vars = vi->variantsstr;
		if (!varset) {
			fprintf (stderr, "%s: tried to use variants without active varset!\n", what);
			db->estatus = 1;
			return;
		}
		struct rnnvarset *vs = 0;
		int nvars = varset->valsnum;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == varset) {
				vs = vi->varsets[i];
				break;
			}
		if (!vs) {
			vs = calloc (sizeof *vs, 1);
			vs->venum = varset;
			vs->variants = calloc(sizeof *vs->variants, nvars);
			for (i = 0; i < nvars; i++)
				vs->variants[i] = 1;
			ADDARRAY(vi->varsets, vs);
		}
		while (1) {
			while (*vars == ' ') vars++;
			if (*vars == 0)
				break;
			char *split = vars;
			while (*split != ':' && *split != '-' && *split != ' '  && *split != 0)
				split++;
			char *first = 0;
			if (split != vars)
				first = strndup(vars, split-vars);
			if (*split == ' ' || *split == 0) {
				int idx = findvidx(db, varset, first);
				if (idx != -1)
					vs->variants[idx] |= 2;
				vars = split;
			} else {
				char *end = split+1;
				while (*end != ' '  && *end != 0)
					end++;
				char *second = 0;
				if (end != split+1)
					second = strndup(split+1, end-split-1);
				int idx1 = 0;
				if (first)
					idx1 = findvidx(db, varset, first);
				int idx2 = nvars;
				if (second) {
					idx2 = findvidx(db, varset, second);
					if (*split == '-')
						idx2++;
				}
				if (idx1 != -1 && idx2 != -1)
					for (i = idx1; i < idx2; i++)
						vs->variants[i] |= 2;
				vars = end;
				free(second);
			}
			free(first);
		}
		vi->dead = 1;
		for (i = 0; i < nvars; i++) {
			vs->variants[i] = (vs->variants[i] == 3);
			if (vs->variants[i])
				vi->dead = 0;
		}
	}
	if (vi->dead)
		return;
	if (vi->prefenum) {
		struct rnnvarset *vs = 0;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == vi->prefenum) {
				vs = vi->varsets[i];
				break;
			}
		if (vs) {
			for (i = 0; i < vi->prefenum->valsnum; i++)
				if (vs->variants[i]) {
					vi->prefix = strdup(vi->prefenum->vals[i]->name);
					return;
				}
		} else {
			vi->prefix = strdup(vi->prefenum->vals[0]->name);
		}
	}
}